

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_level.cpp
# Opt level: O3

void G_DoWorldDone(void)

{
  gamestate = GS_LEVEL;
  if (*wminfo.next.Chars == '\0') {
    Printf("No next map specified.\n");
  }
  else {
    FString::operator=(&level.MapName,&nextlevel);
  }
  G_StartTravel();
  G_DoLoadLevel(startpos,true);
  startpos = 0;
  gameaction = ga_nothing;
  viewactive = true;
  return;
}

Assistant:

void G_DoWorldDone (void) 
{		 
	gamestate = GS_LEVEL;
	if (wminfo.next[0] == 0)
	{
		// Don't crash if no next map is given. Just repeat the current one.
		Printf ("No next map specified.\n");
	}
	else
	{
		level.MapName = nextlevel;
	}
	G_StartTravel ();
	G_DoLoadLevel (startpos, true);
	startpos = 0;
	gameaction = ga_nothing;
	viewactive = true; 
}